

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O2

cmCMakePath * __thiscall
cmCMakePath::Absolute(cmCMakePath *__return_storage_ptr__,cmCMakePath *this,path *base)

{
  bool bVar1;
  string sStack_68;
  path path;
  
  bVar1 = std::filesystem::__cxx11::path::is_relative(&this->Path);
  if (bVar1) {
    std::filesystem::__cxx11::path::path(&path,base);
    std::filesystem::__cxx11::path::operator/=(&path,&this->Path);
    std::filesystem::__cxx11::path::generic_string(&sStack_68,&path);
    cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&sStack_68,generic_format)
    ;
    std::__cxx11::string::~string((string *)&sStack_68);
    std::filesystem::__cxx11::path::~path(&path);
  }
  else {
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->Path,&this->Path);
  }
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::Absolute(const cm::filesystem::path& base) const
{
  if (this->Path.is_relative()) {
    auto path = base;
    path /= this->Path;
    // filesystem::path::operator/= use preferred_separator ('\' on Windows)
    // so converts back to '/'
    return path.generic_string();
  }
  return *this;
}